

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O1

int32_t __thiscall
icu_63::Edits::Iterator::findIndex(Iterator *this,int32_t i,UBool findSource,UErrorCode *errorCode)

{
  int32_t *piVar1;
  int32_t *piVar2;
  uint uVar3;
  UBool UVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int32_t iVar8;
  int iVar9;
  int32_t *piVar10;
  int iVar11;
  
  iVar8 = -1;
  if ((-1 < i) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    piVar1 = &this->oldLength_;
    piVar2 = &this->newLength_;
    uVar7 = (ulong)(findSource == '\0');
    piVar10 = piVar1;
    if (findSource == '\0') {
      piVar10 = piVar2;
    }
    uVar3 = (&this->srcIndex)[uVar7 * 2];
    if (i < (int)uVar3) {
      if ((int)(uVar3 >> 1) <= i) {
        previous(this,errorCode);
        iVar6 = (&this->srcIndex)[uVar7 * 2];
        if (iVar6 <= i) {
          return 0;
        }
        do {
          iVar5 = this->remaining;
          if (0 < iVar5) {
            iVar11 = ((this->array[this->index] & 0x1ff) - iVar5) + 1;
            iVar9 = iVar6 - iVar11 * (&this->oldLength_)[uVar7];
            if (i < iVar9) {
              this->srcIndex = this->srcIndex - this->oldLength_ * iVar11;
              iVar11 = iVar11 * this->newLength_;
              this->replIndex = this->replIndex - iVar11;
              this->destIndex = this->destIndex - iVar11;
              iVar6 = 0;
            }
            else {
              iVar6 = (iVar6 + ~i) / (&this->oldLength_)[uVar7];
              iVar11 = iVar6 + 1;
              this->srcIndex = this->srcIndex - this->oldLength_ * iVar11;
              iVar11 = iVar11 * this->newLength_;
              this->replIndex = this->replIndex - iVar11;
              this->destIndex = this->destIndex - iVar11;
              iVar6 = iVar6 + iVar5 + 1;
            }
            this->remaining = iVar6;
            if (iVar9 <= i) {
              return 0;
            }
          }
          previous(this,errorCode);
          iVar6 = (&this->srcIndex)[uVar7 * 2];
          if (iVar6 <= i) {
            return 0;
          }
        } while( true );
      }
      this->dir = '\0';
      this->remaining = 0;
      this->index = 0;
      this->destIndex = 0;
      this->oldLength_ = 0;
      this->newLength_ = 0;
      this->srcIndex = 0;
      this->replIndex = 0;
    }
    else if (i < (int)(uVar3 + *piVar10)) {
      return 0;
    }
    UVar4 = next(this,'\0',errorCode);
    iVar8 = 1;
    if (UVar4 != '\0') {
      do {
        iVar6 = (&this->srcIndex)[uVar7 * 2];
        iVar5 = (&this->oldLength_)[uVar7];
        if (i < iVar5 + iVar6) {
          return 0;
        }
        iVar9 = this->remaining;
        if (1 < iVar9) {
          iVar11 = iVar9 * iVar5 + iVar6;
          if (i < iVar11) {
            iVar5 = (i - iVar6) / iVar5;
            this->srcIndex = this->srcIndex + this->oldLength_ * iVar5;
            iVar9 = iVar9 - iVar5;
            iVar5 = iVar5 * this->newLength_;
            this->replIndex = this->replIndex + iVar5;
            this->destIndex = this->destIndex + iVar5;
          }
          else {
            *piVar1 = *piVar1 * iVar9;
            *piVar2 = iVar9 * *piVar2;
            iVar9 = 0;
          }
          this->remaining = iVar9;
          if (i < iVar11) {
            return 0;
          }
        }
        UVar4 = next(this,'\0',errorCode);
      } while (UVar4 != '\0');
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

int32_t Edits::Iterator::findIndex(int32_t i, UBool findSource, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode) || i < 0) { return -1; }
    int32_t spanStart, spanLength;
    if (findSource) {  // find source index
        spanStart = srcIndex;
        spanLength = oldLength_;
    } else {  // find destination index
        spanStart = destIndex;
        spanLength = newLength_;
    }
    if (i < spanStart) {
        if (i >= (spanStart / 2)) {
            // Search backwards.
            for (;;) {
                UBool hasPrevious = previous(errorCode);
                U_ASSERT(hasPrevious);  // because i>=0 and the first span starts at 0
                (void)hasPrevious;  // avoid unused-variable warning
                spanStart = findSource ? srcIndex : destIndex;
                if (i >= spanStart) {
                    // The index is in the current span.
                    return 0;
                }
                if (remaining > 0) {
                    // Is the index in one of the remaining compressed edits?
                    // spanStart is the start of the current span, first of the remaining ones.
                    spanLength = findSource ? oldLength_ : newLength_;
                    int32_t u = array[index];
                    U_ASSERT(MAX_UNCHANGED < u && u <= MAX_SHORT_CHANGE);
                    int32_t num = (u & SHORT_CHANGE_NUM_MASK) + 1 - remaining;
                    int32_t len = num * spanLength;
                    if (i >= (spanStart - len)) {
                        int32_t n = ((spanStart - i - 1) / spanLength) + 1;
                        // 1 <= n <= num
                        srcIndex -= n * oldLength_;
                        replIndex -= n * newLength_;
                        destIndex -= n * newLength_;
                        remaining += n;
                        return 0;
                    }
                    // Skip all of these edits at once.
                    srcIndex -= num * oldLength_;
                    replIndex -= num * newLength_;
                    destIndex -= num * newLength_;
                    remaining = 0;
                }
            }
        }
        // Reset the iterator to the start.
        dir = 0;
        index = remaining = oldLength_ = newLength_ = srcIndex = replIndex = destIndex = 0;
    } else if (i < (spanStart + spanLength)) {
        // The index is in the current span.
        return 0;
    }
    while (next(FALSE, errorCode)) {
        if (findSource) {
            spanStart = srcIndex;
            spanLength = oldLength_;
        } else {
            spanStart = destIndex;
            spanLength = newLength_;
        }
        if (i < (spanStart + spanLength)) {
            // The index is in the current span.
            return 0;
        }
        if (remaining > 1) {
            // Is the index in one of the remaining compressed edits?
            // spanStart is the start of the current span, first of the remaining ones.
            int32_t len = remaining * spanLength;
            if (i < (spanStart + len)) {
                int32_t n = (i - spanStart) / spanLength;  // 1 <= n <= remaining - 1
                srcIndex += n * oldLength_;
                replIndex += n * newLength_;
                destIndex += n * newLength_;
                remaining -= n;
                return 0;
            }
            // Make next() skip all of these edits at once.
            oldLength_ *= remaining;
            newLength_ *= remaining;
            remaining = 0;
        }
    }
    return 1;
}